

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O0

void __thiscall
Employee::Employee(Employee *this,Person *person,Address *address,Employee *employee)

{
  Address local_88;
  Employee *local_28;
  Employee *employee_local;
  Address *address_local;
  Person *person_local;
  Employee *this_local;
  
  local_28 = employee;
  employee_local = (Employee *)address;
  address_local = (Address *)person;
  person_local = &this->super_Person;
  Address::Address(&local_88,address);
  Person::Person(&this->super_Person,person,&local_88);
  Address::~Address(&local_88);
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_validate_0014ad20;
  this->hourWork = local_28->hourWork;
  this->salaryPerHour = local_28->salaryPerHour;
  this->workToDo = local_28->workToDo;
  this->workDone = local_28->workDone;
  return;
}

Assistant:

Employee::Employee(const Person &person, Address address, const Employee &employee) : Person(person, address) {

    this->hourWork = employee.hourWork;
    this->salaryPerHour = employee.salaryPerHour;
    this->workToDo = employee.workToDo;
    this->workDone = employee.workDone;

}